

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int json5Whitespace(char *zIn)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  u8 c_1;
  char c;
  int j_1;
  int j;
  u8 *z;
  int n;
  char *zIn_local;
  
  n = 0;
  do {
    while( true ) {
      while( true ) {
        while ((uVar3 = (uint)(byte)zIn[n], uVar3 - 9 < 5 || (uVar3 == 0x20))) {
          n = n + 1;
        }
        if (uVar3 == 0x2f) break;
        if (uVar3 == 0xc2) {
          if (zIn[n + 1] != -0x60) {
            return n;
          }
          n = n + 2;
        }
        else if (uVar3 == 0xe1) {
          if (zIn[n + 1] != -0x66) {
            return n;
          }
          if (zIn[n + 2] != -0x80) {
            return n;
          }
          n = n + 3;
        }
        else if (uVar3 == 0xe2) {
          if (zIn[n + 1] == -0x80) {
            bVar2 = zIn[n + 2];
            if (bVar2 < 0x80) {
              return n;
            }
            if (((0x8a < bVar2) && (bVar2 != 0xa8)) && ((bVar2 != 0xa9 && (bVar2 != 0xaf)))) {
              return n;
            }
            n = n + 3;
          }
          else {
            if (zIn[n + 1] != -0x7f) {
              return n;
            }
            if (zIn[n + 2] != -0x61) {
              return n;
            }
            n = n + 3;
          }
        }
        else if (uVar3 == 0xe3) {
          if (zIn[n + 1] != -0x80) {
            return n;
          }
          if (zIn[n + 2] != -0x80) {
            return n;
          }
          n = n + 3;
        }
        else {
          if (uVar3 != 0xef) {
            return n;
          }
          if (zIn[n + 1] != -0x45) {
            return n;
          }
          if (zIn[n + 2] != -0x41) {
            return n;
          }
          n = n + 3;
        }
      }
      if ((zIn[n + 1] != '*') || (zIn[n + 2] == '\0')) break;
      j = n + 3;
      while( true ) {
        bVar4 = true;
        if (zIn[j] == '/') {
          bVar4 = zIn[j + -1] != '*';
        }
        if (!bVar4) break;
        if (zIn[j] == '\0') {
          return n;
        }
        j = j + 1;
      }
      n = j + 1;
    }
    if (zIn[n + 1] != '/') {
      return n;
    }
    j_1 = n + 2;
    while( true ) {
      cVar1 = zIn[j_1];
      if (((cVar1 == '\0') || (cVar1 == '\n')) || (cVar1 == '\r')) goto LAB_0023464e;
      if (((cVar1 == -0x1e) && (zIn[j_1 + 1] == -0x80)) &&
         ((zIn[j_1 + 2] == -0x58 || (zIn[j_1 + 2] == -0x57)))) break;
      j_1 = j_1 + 1;
    }
    j_1 = j_1 + 2;
LAB_0023464e:
    n = j_1;
    if (zIn[j_1] != '\0') {
      n = j_1 + 1;
    }
  } while( true );
}

Assistant:

static int json5Whitespace(const char *zIn){
  int n = 0;
  const u8 *z = (u8*)zIn;
  while( 1 /*exit by "goto whitespace_done"*/ ){
    switch( z[n] ){
      case 0x09:
      case 0x0a:
      case 0x0b:
      case 0x0c:
      case 0x0d:
      case 0x20: {
        n++;
        break;
      }
      case '/': {
        if( z[n+1]=='*' && z[n+2]!=0 ){
          int j;
          for(j=n+3; z[j]!='/' || z[j-1]!='*'; j++){
            if( z[j]==0 ) goto whitespace_done;
          }
          n = j+1;
          break;
        }else if( z[n+1]=='/' ){
          int j;
          char c;
          for(j=n+2; (c = z[j])!=0; j++){
            if( c=='\n' || c=='\r' ) break;
            if( 0xe2==(u8)c && 0x80==(u8)z[j+1]
             && (0xa8==(u8)z[j+2] || 0xa9==(u8)z[j+2])
            ){
              j += 2;
              break;
            }
          }
          n = j;
          if( z[n] ) n++;
          break;
        }
        goto whitespace_done;
      }
      case 0xc2: {
        if( z[n+1]==0xa0 ){
          n += 2;
          break;
        }
        goto whitespace_done;
      }
      case 0xe1: {
        if( z[n+1]==0x9a && z[n+2]==0x80 ){
          n += 3;
          break;
        }
        goto whitespace_done;
      }
      case 0xe2: {
        if( z[n+1]==0x80 ){
          u8 c = z[n+2];
          if( c<0x80 ) goto whitespace_done;
          if( c<=0x8a || c==0xa8 || c==0xa9 || c==0xaf ){
            n += 3;
            break;
          }
        }else if( z[n+1]==0x81 && z[n+2]==0x9f ){
          n += 3;
          break;
        }
        goto whitespace_done;
      }
      case 0xe3: {
        if( z[n+1]==0x80 && z[n+2]==0x80 ){
          n += 3;
          break;
        }
        goto whitespace_done;
      }
      case 0xef: {
        if( z[n+1]==0xbb && z[n+2]==0xbf ){
          n += 3;
          break;
        }
        goto whitespace_done;
      }
      default: {
        goto whitespace_done;
      }
    }
  }
  whitespace_done:
  return n;
}